

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O2

int unlink(char *__name)

{
  ll_head *plVar1;
  ulong uVar2;
  ulong uVar3;
  ll_head *plVar4;
  ll_elem *plVar6;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t count;
  size_t count_00;
  size_t extraout_RDX_02;
  size_t sVar7;
  size_t count_01;
  size_t extraout_RDX_03;
  size_t count_02;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  ll_elem *n;
  ulong in_RSI;
  ll_head *plVar8;
  bool bVar9;
  ll_head *plVar5;
  
  if (((ulong)__name & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x267,
                  "int unlink(struct ll_head *, struct ll_elem *)");
  }
  n = (ll_elem *)(in_RSI & 0xfffffffffffffffc);
  if (n == (ll_elem *)0x0) {
    __assert_fail("n != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x269,
                  "int unlink(struct ll_head *, struct ll_elem *)");
  }
  if (n->succ < 4) {
    return 0;
  }
  do {
  } while ((n->succ & 2) != 0);
LAB_001012ac:
  plVar1 = (ll_head *)pred((ll_head *)__name,n);
  plVar8 = (ll_head *)((ulong)plVar1 & 0xfffffffffffffffc);
  if (plVar8 == (ll_head *)0x0) {
    return 0;
  }
  sVar7 = extraout_RDX;
  if (((ulong)plVar1 & 2) != 0) {
LAB_00101437:
    deref_release(plVar1,(ll_elem *)0x1,sVar7);
    return 0;
  }
  do {
    uVar2 = (plVar8->q).succ;
    do {
      LOCK();
      uVar3 = (plVar8->q).succ;
      bVar9 = uVar2 == uVar3;
      if (bVar9) {
        (plVar8->q).succ = uVar2 | 1;
        uVar3 = uVar2;
      }
      UNLOCK();
      uVar2 = uVar3;
    } while (!bVar9);
    if ((uVar3 & 1) == 0) {
      if ((ll_elem *)(uVar3 & 0xfffffffffffffffc) == n) {
        if (((plVar8->q).succ & 1) == 0) {
          __assert_fail("atomic_load_explicit(&ptr_clear(p)->succ, memory_order_relaxed) & DEREF",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                        0x292,"int unlink(struct ll_head *, struct ll_elem *)");
        }
        if ((ll_elem *)((plVar8->q).succ & 0xfffffffffffffffc) != n) {
          __assert_fail("ptr_clear((struct ll_elem*)atomic_load_explicit( &ptr_clear(p)->succ, memory_order_relaxed)) == n"
                        ,"/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c"
                        ,0x294,"int unlink(struct ll_head *, struct ll_elem *)");
        }
        if ((ll_elem *)((plVar8->q).succ & 0xfffffffffffffffc) != n) {
          __assert_fail("ptr_clear((struct ll_elem*)atomic_load_explicit( &ptr_clear(p)->succ, memory_order_relaxed)) == n"
                        ,"/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c"
                        ,0x2a6,"int unlink(struct ll_head *, struct ll_elem *)");
        }
        if (((ulong)plVar1 & 1) != 0) {
          __assert_fail("!((uintptr_t)p & DEREF)",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                        0x2a7,"int unlink(struct ll_head *, struct ll_elem *)");
        }
        plVar4 = plVar1;
        goto LAB_00101338;
      }
      ptr_clear_deref((elem_ptr_t *)plVar8);
      sVar7 = extraout_RDX_00;
      break;
    }
  } while ((ll_elem *)(uVar3 & 0xfffffffffffffffc) == n);
  goto LAB_00101363;
  while( true ) {
    if (((ulong)plVar5 & 2) != 0) {
      ptr_clear_deref((elem_ptr_t *)plVar8);
      sVar7 = extraout_RDX_05;
      plVar1 = plVar8;
      goto LAB_00101437;
    }
    plVar4 = plVar8;
    if ((ll_head *)((ulong)plVar5 & 0xfffffffffffffffc) != plVar8) break;
LAB_00101338:
    LOCK();
    plVar5 = (ll_head *)n->pred;
    bVar9 = plVar4 == plVar5;
    if (bVar9) {
      n->pred = (ulong)plVar1 | 2;
      plVar5 = plVar4;
    }
    UNLOCK();
    if (bVar9) {
      ptr_clear_deref((elem_ptr_t *)plVar8);
      plVar1 = (ll_head *)succ((ll_head *)__name,(ll_elem *)plVar8);
      deref_release(plVar1,(ll_elem *)0x1,count);
      deref_release(plVar8,(ll_elem *)0x1,count_00);
      LOCK();
      *(long *)(__name + 0x18) = *(long *)(__name + 0x18) + -1;
      UNLOCK();
      plVar6 = succ((ll_head *)__name,n);
      sVar7 = extraout_RDX_02;
      goto LAB_001013bd;
    }
  }
  ptr_clear_deref((elem_ptr_t *)plVar8);
  sVar7 = extraout_RDX_01;
  plVar1 = plVar8;
LAB_00101363:
  deref_release(plVar1,(ll_elem *)0x1,sVar7);
  goto LAB_001012ac;
LAB_001013bd:
  plVar1 = (ll_head *)((ulong)plVar6 & 0xfffffffffffffffc);
  if (n->refcnt < 2) {
LAB_00101411:
    deref_release(plVar1,(ll_elem *)0x1,sVar7);
    return 1;
  }
  if ((ll_elem *)((plVar1->q).pred & 0xfffffffffffffffc) == n) {
    plVar8 = (ll_head *)pred((ll_head *)__name,(ll_elem *)plVar1);
    deref_release(plVar8,(ll_elem *)0x1,count_01);
    sVar7 = extraout_RDX_03;
  }
  if (plVar1 == (ll_head *)__name) goto LAB_00101411;
  plVar6 = succ((ll_head *)__name,(ll_elem *)plVar1);
  deref_release(plVar1,(ll_elem *)0x1,count_02);
  sVar7 = extraout_RDX_04;
  goto LAB_001013bd;
}

Assistant:

static int
unlink(struct ll_head *q_head, struct ll_elem *n)
{
	struct ll_elem	*q, *p, *p_, *i, *i_;

	q = &q_head->q;
	/* Argument validation. */
	assert(q == ptr_clear(q));
	n = ptr_clear(n);
	assert(n != NULL);

	/*
	 * Since we hold the reference to n, it cannot be removed completely
	 * before we return.
	 * However it can be that this function was called while n is not on
	 * the queue, hence test that now and fail if that is the case.
	 */
	if (ptr_clear((struct ll_elem*)atomic_load_explicit(&n->succ,
	    memory_order_relaxed)) == NULL)
		return 0;

	/* Ensure n is not halfway an insert. */
	while (atomic_load_explicit(&n->succ, memory_order_relaxed) & FLAGGED)
		SPINWAIT();

restart:
	/*
	 * Update n->pred to the deleted state, taking care n->pred->succ
	 * points at n.
	 * Fails if n->pred is already marked as deleted.
	 */
	for (;;) {
		p = pred(q_head, n);
		/*
		 * p can become null, if we acquired our reference between
		 * another unlink_release detecting a refcnt of 1 and
		 * it clearing its pred/succ pointers.
		 */
		if (ptr_clear(p) == NULL)
			return 0;

		if (deleted_ptr(p)) {
			/* Another thread marked n->pred with deletion. */
			deref_release(q_head, p, 1);
			return 0;
		}

		/* Lock down p->succ and ensure it points at n. */
		if (unlink_ps_lock(q_head, p, n)) {
			assert(atomic_load_explicit(&ptr_clear(p)->succ,
			    memory_order_relaxed) & DEREF);
			assert(ptr_clear((struct ll_elem*)atomic_load_explicit(
			    &ptr_clear(p)->succ, memory_order_relaxed)) == n);
			break;			/* GUARD */
		}

		/*
		 * p no longer points at n.  Re-resolve p.
		 */
		deref_release(q_head, p, 1);
	}
	/*
	 * p - direct predecessor of n.
	 * p->succ - locked, pointing at n.
	 *
	 * Update n->prev to point at p and mark it as deleted.
	 * Note that another thread can have acquired the deletion mark,
	 * between our looking up of the predecessor and locking down p->succ.
	 */
	assert(ptr_clear((struct ll_elem*)atomic_load_explicit(
	    &ptr_clear(p)->succ, memory_order_relaxed)) == n);
	assert(!((uintptr_t)p & DEREF));
	assert(!((uintptr_t)p & FLAGGED));

	/* Acquire deletion lock. */
	p_ = p;
	p = ptr_clear(p);
	while (!atomic_compare_exchange_weak_explicit(&n->pred,
	    (uintptr_t*)&p_, (uintptr_t)p | FLAGGED,
	    memory_order_acq_rel, memory_order_relaxed)) {
		if (((uintptr_t)p_ & FLAGGED) || ptr_clear(p_) != p) {
			/* We have to restart or abort. */
			ptr_clear_deref(&p->succ);
			deref_release(q_head, p, 1);

			/* Another thread deleted n. */
			if ((uintptr_t)p_ & FLAGGED)
				return 0;
			/*
			 * n->pred changed from under us (indicates p is being
			 * deleted as well).
			 */
			goto restart;
		}

		assert(ptr_clear(p_) == p);
		p_ = p;
		SPINWAIT();
	}
	ptr_clear_deref(&p->succ);	/* Unlock p->succ. */

	/*
	 * n is succesfully marked as deleted,
	 * with the correct value for n->pred
	 * (the immediate predecessor, as required by the invariants).
	 *
	 * Update our predecessor p to skip n.
	 */
	deref_release(q_head, succ(q_head, p), 1);
	deref_release(q_head, p, 1);
	atomic_fetch_sub_explicit(&q_head->size, 1, memory_order_relaxed);

	/*
	 * Loop the list forward, clearing up references until our refcount
	 * becomes 1 or the list is exhausted.
	 */
	i = ptr_clear(succ(q_head, n));
	while (atomic_load_explicit(&n->refcnt, memory_order_relaxed) > 1) {
		/* If i points at n, update its pred pointer. */
		if (ptr_clear((struct ll_elem*)atomic_load_explicit(&i->pred,
		    memory_order_relaxed)) == n)
			deref_release(q_head, pred(q_head, i), 1);

		/* GUARD: stop at end of q. */
		if (i == q)
			break;

		/* Skip to next element. */
		i_ = i;
		i = ptr_clear(succ(q_head, i));
		deref_release(q_head, i_, 1);
	}
	deref_release(q_head, i, 1);
	return 1;
}